

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

equality_t bn_cmp(bn_t *a,bn_t *b)

{
  int iVar1;
  
  iVar1 = bignum_cmp(&a->inner,&b->inner);
  if (iVar1 + 1U < 3) {
    return *(equality_t *)(&DAT_0010514c + (ulong)(iVar1 + 1U) * 4);
  }
  PANIC("bn_cmp",
        "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/src/cpwn/stdpwn/bignum.c"
        ,0xc2);
}

Assistant:

equality_t
bn_cmp(bn_t* a, bn_t* b)
{
  int bn_cmp_result = bignum_cmp(&a->inner, &b->inner);
  switch (bn_cmp_result) {
    case LARGER:
      return Bigger;
      break;
    case SMALLER:
      return Smaller;
      break;
    case EQUAL:
      return Equal;
      break;
    default:
      /* memory corruption detected */
      PANIC("bn_cmp", __FILE__, __LINE__);
  }
}